

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall TApp_SubcomInheritCaseCheck_Test::TestBody(TApp_SubcomInheritCaseCheck_Test *this)

{
  App *this_00;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__x;
  input_t *piVar1;
  pointer *pppAVar2;
  bool bVar3;
  App *pAVar4;
  undefined8 uVar5;
  char *pcVar6;
  AssertionResult gtest_ar;
  App *sub2;
  App *sub1;
  AssertHelper local_100;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_f8;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  unsigned_long local_c8;
  App *local_c0;
  App *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &(this->super_TApp).app;
  CLI::App::ignore_case(this_00,true);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sub1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pAVar4 = CLI::App::add_subcommand(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_b8 = pAVar4;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sub2","");
  pcVar6 = "";
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  pAVar4 = CLI::App::add_subcommand(this_00,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_c0 = pAVar4;
  TApp::run(&this->super_TApp);
  local_100.data_ = (AssertHelperData *)0x0;
  __x = &(this->super_TApp).app.parsed_subcommands_;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_f8,__x);
  local_c8 = (long)local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_d8,"(size_t)0","app.get_subcommands().size()",(unsigned_long *)&local_100,
             &local_c8);
  if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1ff,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        (*(code *)((*local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->name_)._M_dataplus._M_p)();
      }
      local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  pppAVar2 = &local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppAVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"SuB1","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_f8,
             local_d8);
  if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppAVar2) {
    operator_delete(local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  TApp::run(&this->super_TApp);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_f8,__x);
  if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
              (local_d8,"sub1","app.get_subcommands().at(0)",&local_b8,
               local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x204,pcVar6);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_f8.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CLI::App::reset(this_00);
    local_100.data_ = (AssertHelperData *)0x0;
    CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_f8,__x);
    local_c8 = (long)local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_d8,"(size_t)0","app.get_subcommands().size()",(unsigned_long *)&local_100,
               &local_c8);
    if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x207,pcVar6);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_f8.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppAVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"sUb2","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_f8
               ,local_d8);
    if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppAVar2) {
      operator_delete(local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    TApp::run(&this->super_TApp);
    CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_f8,__x);
    if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
                (local_d8,"sub2","app.get_subcommands().at(0)",&local_c0,
                 local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_f8);
        if (local_d0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                   ,0x20b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0)) {
            (*(code *)*(pointer)((long)*local_f8.
                                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start + 8))();
          }
          local_f8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  __clang_call_terminate(uVar5);
}

Assistant:

TEST_F(TApp, SubcomInheritCaseCheck) {
    app.ignore_case();
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    run();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    app.reset();
    args = {"SuB1"};
    run();
    EXPECT_EQ(sub1, app.get_subcommands().at(0));

    app.reset();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    args = {"sUb2"};
    run();
    EXPECT_EQ(sub2, app.get_subcommands().at(0));
}